

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NamedPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::PropertyExprSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,PropertyExprSyntax **args_4,Token *args_5)

{
  PropertyExprSyntax *pPVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  NamedPortConnectionSyntax *this_00;
  
  this_00 = (NamedPortConnectionSyntax *)allocate(this,0x98,8);
  TVar6 = args_1->kind;
  uVar7 = args_1->field_0x2;
  NVar8.raw = (args_1->numFlags).raw;
  uVar9 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar10 = args_2->kind;
  uVar11 = args_2->field_0x2;
  NVar12.raw = (args_2->numFlags).raw;
  uVar13 = args_2->rawLen;
  pIVar3 = args_2->info;
  TVar14 = args_3->kind;
  uVar15 = args_3->field_0x2;
  NVar16.raw = (args_3->numFlags).raw;
  uVar17 = args_3->rawLen;
  pIVar4 = args_3->info;
  pPVar1 = *args_4;
  TVar18 = args_5->kind;
  uVar19 = args_5->field_0x2;
  NVar20.raw = (args_5->numFlags).raw;
  uVar21 = args_5->rawLen;
  pIVar5 = args_5->info;
  slang::syntax::PortConnectionSyntax::PortConnectionSyntax
            ((PortConnectionSyntax *)this_00,NamedPortConnection,args);
  (this_00->dot).kind = TVar6;
  (this_00->dot).field_0x2 = uVar7;
  (this_00->dot).numFlags = (NumericTokenFlags)NVar8.raw;
  (this_00->dot).rawLen = uVar9;
  (this_00->dot).info = pIVar2;
  (this_00->name).kind = TVar10;
  (this_00->name).field_0x2 = uVar11;
  (this_00->name).numFlags = (NumericTokenFlags)NVar12.raw;
  (this_00->name).rawLen = uVar13;
  (this_00->name).info = pIVar3;
  (this_00->openParen).kind = TVar14;
  (this_00->openParen).field_0x2 = uVar15;
  (this_00->openParen).numFlags = (NumericTokenFlags)NVar16.raw;
  (this_00->openParen).rawLen = uVar17;
  (this_00->openParen).info = pIVar4;
  this_00->expr = pPVar1;
  (this_00->closeParen).kind = TVar18;
  (this_00->closeParen).field_0x2 = uVar19;
  (this_00->closeParen).numFlags = (NumericTokenFlags)NVar20.raw;
  (this_00->closeParen).rawLen = uVar21;
  (this_00->closeParen).info = pIVar5;
  if (pPVar1 != (PropertyExprSyntax *)0x0) {
    (pPVar1->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  }
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }